

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int lws_ssl_capable_write_no_ssl(lws *wsi,uchar *buf,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ssize_t sVar6;
  int *piVar7;
  uint *puVar8;
  ushort local_2a;
  uint local_28;
  uint uStack_24;
  uint16_t u16;
  int n;
  int len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  local_28 = 0;
  uStack_24 = len;
  _n = buf;
  buf_local = (uchar *)wsi;
  if (wsi->udp == (lws_udp *)0x0) {
    if ((wsi->role_ops->field_0xc8 & 1) == 0) {
      sVar6 = send((wsi->desc).sockfd,buf,(long)len,0x4000);
      local_28 = (uint)sVar6;
    }
    else {
      sVar6 = write((wsi->desc).sockfd,buf,(long)len);
      local_28 = (uint)sVar6;
    }
  }
  else if (((wsi->context->udp_loss_sim_tx_pc == '\0') ||
           (sVar5 = lws_get_random(wsi->context,&local_2a,2), sVar5 != 2)) ||
          ((uint)*(byte *)(*(long *)(buf_local + 0x1f8) + 0x51f) < ((uint)local_2a * 100) / 0xffff))
  {
    iVar4 = lws_has_buffered_out((lws *)buf_local);
    if (iVar4 == 0) {
      sVar6 = sendto(*(int *)(buf_local + 0x2c0),_n,(long)(int)uStack_24,0,
                     *(sockaddr **)(buf_local + 0x240),
                     *(socklen_t *)(*(long *)(buf_local + 0x240) + 0x10));
      local_28 = (uint)sVar6;
    }
    else {
      sVar6 = sendto(*(int *)(buf_local + 0x2c0),_n,(long)(int)uStack_24,0,
                     (sockaddr *)(*(long *)(buf_local + 0x240) + 0x14),
                     *(socklen_t *)(*(long *)(buf_local + 0x240) + 0x24));
      local_28 = (uint)sVar6;
    }
  }
  else {
    _lws_log(2,"%s: dropping udp tx\n","lws_ssl_capable_write_no_ssl");
    local_28 = uStack_24;
  }
  if ((int)local_28 < 0) {
    piVar7 = __errno_location();
    if (((*piVar7 == 0xb) || (piVar7 = __errno_location(), *piVar7 == 0xb)) ||
       (piVar7 = __errno_location(), uVar3 = uStack_24, uVar2 = local_28, *piVar7 == 4)) {
      __errno_location();
      wsi_local._4_4_ = 0xfffffffc;
    }
    else {
      uVar1 = *(uint *)(buf_local + 0x2c0);
      puVar8 = (uint *)__errno_location();
      _lws_log(0x10,"ERROR writing len %d to skt fd %d err %d / errno %d\n",(ulong)uVar3,
               (ulong)uVar1,(ulong)uVar2,(ulong)*puVar8);
      wsi_local._4_4_ = 0xffffffff;
    }
  }
  else {
    wsi_local._4_4_ = local_28;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_ssl_capable_write_no_ssl(struct lws *wsi, unsigned char *buf, int len)
{
	int n = 0;
#if defined(LWS_PLAT_OPTEE)
	ssize_t send(int sockfd, const void *buf, size_t len, int flags);
#endif

#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		if (wsi->context->udp_loss_sim_tx_pc) {
			uint16_t u16;
			/*
			 * We should randomly drop some of these
			 */

			if (lws_get_random(wsi->context, &u16, 2) == 2 &&
			    ((u16 * 100) / 0xffff) <=
				    wsi->context->udp_loss_sim_tx_pc) {
				lwsl_warn("%s: dropping udp tx\n", __func__);
				/* pretend it was sent */
				n = len;
				goto post_send;
			}
		}
		if (lws_has_buffered_out(wsi))
			n = sendto(wsi->desc.sockfd, (const char *)buf,
				   len, 0, &wsi->udp->sa_pending,
				   wsi->udp->salen_pending);
		else
			n = sendto(wsi->desc.sockfd, (const char *)buf,
				   len, 0, &wsi->udp->sa, wsi->udp->salen);
	} else
#endif
		if (wsi->role_ops->file_handle)
			n = write((int)(long long)wsi->desc.filefd, buf, len);
		else
			n = send(wsi->desc.sockfd, (char *)buf, len, MSG_NOSIGNAL);
//	lwsl_info("%s: sent len %d result %d", __func__, len, n);

#if defined(LWS_WITH_UDP)
post_send:
#endif
	if (n >= 0)
		return n;

	if (LWS_ERRNO == LWS_EAGAIN ||
	    LWS_ERRNO == LWS_EWOULDBLOCK ||
	    LWS_ERRNO == LWS_EINTR) {
		if (LWS_ERRNO == LWS_EWOULDBLOCK) {
			lws_set_blocking_send(wsi);
		}

		return LWS_SSL_CAPABLE_MORE_SERVICE;
	}

	lwsl_debug("ERROR writing len %d to skt fd %d err %d / errno %d\n",
		   len, wsi->desc.sockfd, n, LWS_ERRNO);

	return LWS_SSL_CAPABLE_ERROR;
}